

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeNaN.cpp
# Opt level: O0

bool __thiscall wasm::DeNaN::hasNaNLane(DeNaN *this,Const *c)

{
  Type *this_00;
  bool bVar1;
  int64_t iVar2;
  Literal local_78;
  undefined1 local_50 [8];
  Literal test32;
  Literal value;
  Const *c_local;
  DeNaN *this_local;
  
  value.type.id._4_4_ = 6;
  bVar1 = wasm::Type::operator==
                    (&(c->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type,
                     (BasicType *)((long)&value.type.id + 4));
  if (!bVar1) {
    __assert_fail("c->type == Type::v128",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DeNaN.cpp"
                  ,0xce,"bool wasm::DeNaN::hasNaNLane(Const *)");
  }
  this_00 = &test32.type;
  wasm::Literal::Literal((Literal *)this_00,&c->value);
  wasm::Literal::eqF32x4((Literal *)local_50,(Literal *)this_00,(Literal *)this_00);
  wasm::Literal::allTrueI32x4(&local_78,(Literal *)local_50);
  wasm::Literal::operator=((Literal *)local_50,&local_78);
  wasm::Literal::~Literal(&local_78);
  iVar2 = wasm::Literal::getInteger((Literal *)local_50);
  wasm::Literal::~Literal((Literal *)local_50);
  wasm::Literal::~Literal((Literal *)&test32.type);
  return (bool)((iVar2 != 0 ^ 0xffU) & 1);
}

Assistant:

bool hasNaNLane(Const* c) {
    assert(c->type == Type::v128);
    auto value = c->value;

    // Compute if all f32s are equal to themselves.
    auto test32 = value.eqF32x4(value);
    test32 = test32.allTrueI32x4();

    return !test32.getInteger();
  }